

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O1

vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_> *
__thiscall
grammar::cyclic_path
          (vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
           *__return_storage_ptr__,grammar *this)

{
  pointer psVar1;
  iterator __position;
  key_type *pkVar2;
  key_type *pkVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  undefined8 uVar6;
  ulong uVar7;
  key_type *pkVar8;
  ulong uVar9;
  ulong uVar10;
  key_type *pkVar11;
  long lVar12;
  key_type *__x;
  size_t start_symbol;
  key_type *local_a8;
  key_type *pkStack_a0;
  long local_98;
  unsigned_long local_90;
  strong_t<int,_grammar::token_tag> local_84;
  key_type *local_80;
  _Rb_tree<strong_t<int,_grammar::token_tag>,_strong_t<int,_grammar::token_tag>,_std::_Identity<strong_t<int,_grammar::token_tag>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
  local_78;
  grammar *local_40;
  map<strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>_>_>
  *local_38;
  
  local_a8 = (key_type *)0x0;
  pkStack_a0 = (key_type *)0x0;
  local_98 = 0;
  local_90 = 1;
  if (1 < (this->rules)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    local_38 = &this->rules;
    local_40 = this;
    do {
      if (local_a8 == pkStack_a0) {
        local_78._M_impl._0_4_ = 0xffffffff;
        std::
        vector<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>,std::allocator<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>>>
        ::emplace_back<unsigned_long&,int>
                  ((vector<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>,std::allocator<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>>>
                    *)&local_a8,&local_90,(int *)&local_78);
        local_90 = local_90 + 1;
      }
      local_80 = pkStack_a0 + -4;
      pmVar4 = std::
               map<strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_std::vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>_>_>_>
               ::at(local_38,local_80);
      lVar12 = (long)pkStack_a0 - (long)local_a8;
      uVar9 = *(long *)(pkStack_a0 + -2) + 1;
      pkVar8 = local_80;
      do {
        psVar1 = (pmVar4->
                 super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar7 = (long)(pmVar4->
                      super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 2;
        if (((uVar9 < uVar7) && (0 < psVar1[uVar9].internal_rep)) &&
           (psVar1[uVar9].internal_rep != pkVar8->internal_rep)) {
          if (uVar9 != 0) {
            if (uVar7 <= uVar9 - 1) goto LAB_00105597;
            if (psVar1[uVar9 - 1].internal_rep != 0) goto LAB_0010540c;
          }
          if (uVar9 != uVar7 - 1) {
            if (uVar7 <= uVar9 + 1) {
LAB_00105597:
              uVar6 = std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
              if (local_a8 != (key_type *)0x0) {
                operator_delete(local_a8,local_98 - (long)local_a8);
              }
              _Unwind_Resume(uVar6);
            }
            if (psVar1[uVar9 + 1].internal_rep != 0) goto LAB_0010540c;
          }
          *(ulong *)(pkStack_a0 + -2) = uVar9;
          local_78._M_impl._0_4_ = 0xffffffff;
          std::
          vector<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>,std::allocator<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>>>
          ::emplace_back<strong_t<int,grammar::token_tag>const&,int>
                    ((vector<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>,std::allocator<std::pair<strong_t<int,grammar::token_tag>,unsigned_long>>>
                      *)&local_a8,psVar1 + uVar9,(int *)&local_78);
          pkVar8 = local_80;
        }
        else {
LAB_0010540c:
          uVar10 = uVar9;
          if (uVar9 < uVar7) {
            do {
              uVar10 = uVar9;
              if (psVar1[uVar9].internal_rep == 0) break;
              uVar9 = uVar9 + 1;
              uVar10 = uVar7;
            } while (uVar7 != uVar9);
          }
          uVar9 = uVar10 + 1;
          if (uVar7 <= uVar9) {
            pkStack_a0 = pkStack_a0 + -4;
          }
        }
        pkVar2 = pkStack_a0;
      } while ((long)pkStack_a0 - (long)local_a8 == lVar12);
      local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_78._M_impl._0_8_ = 0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_78._M_impl.super__Rb_tree_header._M_header;
      local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_right =
           local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      for (__x = local_a8; __x != pkVar2; __x = __x + 4) {
        sVar5 = std::
                set<strong_t<int,_grammar::token_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                ::count((set<strong_t<int,_grammar::token_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                         *)&local_78,__x);
        if (sVar5 == 0) {
          std::
          _Rb_tree<strong_t<int,grammar::token_tag>,strong_t<int,grammar::token_tag>,std::_Identity<strong_t<int,grammar::token_tag>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<strong_t<int,grammar::token_tag>>>
          ::_M_insert_unique<strong_t<int,grammar::token_tag>const&>
                    ((_Rb_tree<strong_t<int,grammar::token_tag>,strong_t<int,grammar::token_tag>,std::_Identity<strong_t<int,grammar::token_tag>>,std::less<strong_t<int,grammar::token_tag>>,std::allocator<strong_t<int,grammar::token_tag>>>
                      *)&local_78,__x);
        }
        else {
          (__return_storage_ptr__->
          super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
          ::reserve(__return_storage_ptr__,(long)pkStack_a0 - (long)local_a8 >> 4);
          pkVar3 = pkStack_a0;
          for (pkVar11 = local_a8; pkVar11 != pkVar3; pkVar11 = pkVar11 + 4) {
            local_84.internal_rep = pkVar11->internal_rep;
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
              ::_M_realloc_insert<strong_t<int,grammar::token_tag>>
                        ((vector<strong_t<int,grammar::token_tag>,std::allocator<strong_t<int,grammar::token_tag>>>
                          *)__return_storage_ptr__,__position,&local_84);
            }
            else {
              (__position._M_current)->internal_rep = local_84.internal_rep;
              (__return_storage_ptr__->
              super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
              )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
        }
        if (sVar5 != 0) {
          std::
          _Rb_tree<strong_t<int,_grammar::token_tag>,_strong_t<int,_grammar::token_tag>,_std::_Identity<strong_t<int,_grammar::token_tag>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
          ::~_Rb_tree(&local_78);
          goto LAB_0010556f;
        }
      }
      std::
      _Rb_tree<strong_t<int,_grammar::token_tag>,_strong_t<int,_grammar::token_tag>,_std::_Identity<strong_t<int,_grammar::token_tag>_>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
      ::~_Rb_tree(&local_78);
    } while (local_90 < (local_40->rules)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  (__return_storage_ptr__->
  super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0010556f:
  if (local_a8 != (key_type *)0x0) {
    operator_delete(local_a8,local_98 - (long)local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<token_t> grammar::cyclic_path() const {
    // Path so far
    std::vector<std::pair<token_t /*token*/, size_t /*option*/>> path{};

    size_t start_symbol = 1;

    while (start_symbol < nonterminal_count()) {
        // Pick start point
        if (path.empty()) {
            path.emplace_back(start_symbol, -1);
            start_symbol++;
        }

        // Read the options of the path and which option to chose
        const auto & current_symbol = path.back().first;
        const auto & options        = rules.at(current_symbol);
        auto         rule_used      = path.back().second + 1;

        const auto old_path_length = path.size();
        while (path.size() == old_path_length) {
            if (rule_used < options.size()
                and options.at(rule_used) > 0
                // the rule used is pointing at a nonterminal
                and options.at(rule_used) != current_symbol
                // the rule is not generating the same symbol
                and (rule_used == 0 /*there is nothing to the left of us*/
                     or options.at(rule_used - 1) == rule_sep
                     /*the left is a rule separator*/)
                and (rule_used == options.size() - 1
                     or options.at(rule_used + 1) == rule_sep)) {
                // found a valid rule to use
                path.back().second = rule_used;
                path.emplace_back(options.at(rule_used), -1);
            } else {
                // move to the next valid rule
                while (rule_used < options.size()
                       and options.at(rule_used) != rule_sep)
                    rule_used++;
                rule_used++;
                if (rule_used >= options.size()) {
                    // used all options -> go back
                    path.pop_back();
                }
            }
        }

        // Check the path for repeats
        std::set<token_t> seen_nonterminals{};
        for (const auto & entry : path)
            if (seen_nonterminals.count(entry.first) != 0) {
                std::vector<token_t> to_ret;
                to_ret.reserve(path.size());
                std::transform(path.begin(), path.end(),
                               std::back_inserter(to_ret),
                               [](const auto & entry) { return entry.first; });
                return to_ret;
            } else
                seen_nonterminals.insert(entry.first);
    }

    return {};
}